

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,FadExpr<FadUnaryMin<FadExpr<FadFuncSin<Fad<double>_>_>_>_> *fadexpr)

{
  uint uVar1;
  uint uVar2;
  FadExpr<FadFuncSin<Fad<double>_>_> *pFVar3;
  double *pdVar4;
  double *pdVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  
  uVar1 = (((fadexpr->fadexpr_).expr_)->fadexpr_).expr_.dx_.num_elts;
  uVar2 = (this->dx_).num_elts;
  if (uVar1 != uVar2) {
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        pdVar4 = (this->dx_).ptr_to_data;
        if (pdVar4 != (double *)0x0) {
          operator_delete__(pdVar4);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar2 != 0) {
        pdVar4 = (this->dx_).ptr_to_data;
        if (pdVar4 != (double *)0x0) {
          operator_delete__(pdVar4);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar1;
      uVar6 = 0xffffffffffffffff;
      if (-1 < (int)uVar1) {
        uVar6 = (long)(int)uVar1 << 3;
      }
      pdVar4 = (double *)operator_new__(uVar6);
      (this->dx_).ptr_to_data = pdVar4;
    }
  }
  if (uVar1 != 0) {
    pdVar4 = (this->dx_).ptr_to_data;
    if ((((fadexpr->fadexpr_).expr_)->fadexpr_).expr_.dx_.num_elts == 0) {
      if (0 < (int)uVar1) {
        lVar7 = 0;
        do {
          pFVar3 = (fadexpr->fadexpr_).expr_;
          pdVar5 = &(pFVar3->fadexpr_).expr_.defaultVal;
          if ((pFVar3->fadexpr_).expr_.dx_.num_elts != 0) {
            pdVar5 = (double *)((long)(pFVar3->fadexpr_).expr_.dx_.ptr_to_data + lVar7);
          }
          dVar9 = *pdVar5;
          dVar8 = cos((pFVar3->fadexpr_).expr_.val_);
          *(double *)((long)pdVar4 + lVar7) = dVar8 * -dVar9;
          lVar7 = lVar7 + 8;
        } while ((ulong)uVar1 * 8 - lVar7 != 0);
      }
    }
    else if (0 < (int)uVar1) {
      uVar6 = 0;
      do {
        pFVar3 = (fadexpr->fadexpr_).expr_;
        dVar9 = (pFVar3->fadexpr_).expr_.dx_.ptr_to_data[uVar6];
        dVar8 = cos((pFVar3->fadexpr_).expr_.val_);
        pdVar4[uVar6] = dVar8 * -dVar9;
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
    }
  }
  dVar9 = sin((((fadexpr->fadexpr_).expr_)->fadexpr_).expr_.val_);
  this->val_ = -dVar9;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}